

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_posix::create_parsing
                 (locale *in,shared_ptr<__locale_struct_*> *lc,character_facet_type type)

{
  int in_ECX;
  shared_ptr<__locale_struct_*> *in_RSI;
  _Impl *in_RDI;
  shared_ptr<__locale_struct_*> *in_stack_ffffffffffffff68;
  shared_ptr<__locale_struct_*> *in_stack_ffffffffffffff70;
  _Impl *p_Var1;
  
  if (in_ECX == 1) {
    p_Var1 = in_RDI;
    std::shared_ptr<__locale_struct_*>::shared_ptr
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    create_parsing_impl<char>((locale *)p_Var1,in_RSI);
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x286cd3);
  }
  else if (in_ECX == 2) {
    p_Var1 = in_RDI;
    std::shared_ptr<__locale_struct_*>::shared_ptr(in_RSI,in_stack_ffffffffffffff68);
    create_parsing_impl<wchar_t>((locale *)p_Var1,in_RSI);
    std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x286d33);
  }
  else {
    std::locale::locale((locale *)in_RDI,(locale *)in_RSI);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_parsing( std::locale const &in,
                            booster::shared_ptr<locale_t> lc,
                            character_facet_type type)
{
        switch(type) {
        case char_facet: 
            return create_parsing_impl<char>(in,lc);
        case wchar_t_facet:
            return create_parsing_impl<wchar_t>(in,lc);
        default:
            return in;
        }
}